

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O1

int ibuf_realloc(ibuf *buf,size_t len)

{
  int *piVar1;
  u_char *puVar2;
  size_t __size;
  
  __size = buf->wpos + len;
  if (buf->max < __size) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  else {
    puVar2 = (u_char *)realloc(buf->buf,__size);
    if (puVar2 != (u_char *)0x0) {
      buf->buf = puVar2;
      buf->size = len + buf->wpos;
      return 0;
    }
  }
  return -1;
}

Assistant:

int
ibuf_realloc(struct ibuf *buf, size_t len)
{
	u_char	*b;

	/* on static buffers max is eq size and so the following fails */
	if (buf->wpos + len > buf->max) {
		errno = ENOMEM;
		return (-1);
	}

	b = realloc(buf->buf, buf->wpos + len);
	if (b == NULL)
		return (-1);
	buf->buf = b;
	buf->size = buf->wpos + len;

	return (0);
}